

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O3

tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *
generate_list<trng::mrg4>
          (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
           *__return_storage_ptr__,mrg4 *r1,mrg4 *r2,long N,long skip1,long skip2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  int local_a4;
  long local_a0;
  mrg4 *local_98;
  mrg4 *local_90;
  vector<int,_std::allocator<int>_> local_88;
  vector<int,_std::allocator<int>_> local_68;
  _Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
  *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_98 = r2;
  local_90 = r1;
  local_50 = (_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
              *)__return_storage_ptr__;
  local_48 = N;
  local_40 = skip1;
  local_38 = skip2;
  if (0 < N) {
    std::vector<int,_std::allocator<int>_>::reserve(&local_68,N);
    std::vector<int,_std::allocator<int>_>::reserve(&local_88,N);
    lVar6 = 0;
    do {
      iVar7 = (local_90->S).r[0];
      iVar1 = (local_90->S).r[1];
      iVar9 = (local_90->S).r[2];
      uVar4 = (long)(local_90->S).r[3] * (long)(local_90->P).a[3] +
              (long)(local_90->P).a[2] * (long)iVar9 +
              (long)(local_90->P).a[1] * (long)iVar1 + (long)(local_90->P).a[0] * (long)iVar7;
      (local_90->S).r[3] = iVar9;
      uVar5 = (uVar4 >> 0x1f) + (uVar4 & 0x7fffffff);
      uVar4 = uVar5 - 0x1fffffffc;
      if (uVar5 < 0x1fffffffc) {
        uVar4 = uVar5;
      }
      (local_90->S).r[2] = iVar1;
      (local_90->S).r[1] = iVar7;
      uVar5 = uVar4 - 0xfffffffe;
      if (uVar4 < 0xfffffffe) {
        uVar5 = uVar4;
      }
      local_a4 = (int)uVar5 + -0x7fffffff;
      if (uVar5 < 0x7fffffff) {
        local_a4 = (int)uVar5;
      }
      (local_90->S).r[0] = local_a4;
      local_a0 = lVar6;
      if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_68,
                   (iterator)
                   local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_a4);
      }
      else {
        *local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_a4;
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar7 = (local_98->S).r[0];
      iVar1 = (local_98->S).r[1];
      iVar9 = (local_98->S).r[2];
      uVar4 = (long)(local_98->S).r[3] * (long)(local_98->P).a[3] +
              (long)(local_98->P).a[2] * (long)iVar9 +
              (long)(local_98->P).a[1] * (long)iVar1 + (long)(local_98->P).a[0] * (long)iVar7;
      (local_98->S).r[3] = iVar9;
      uVar5 = (uVar4 >> 0x1f) + (uVar4 & 0x7fffffff);
      uVar4 = uVar5 - 0x1fffffffc;
      if (uVar5 < 0x1fffffffc) {
        uVar4 = uVar5;
      }
      (local_98->S).r[2] = iVar1;
      (local_98->S).r[1] = iVar7;
      uVar5 = uVar4 - 0xfffffffe;
      if (uVar4 < 0xfffffffe) {
        uVar5 = uVar4;
      }
      local_a4 = (int)uVar5 + -0x7fffffff;
      if (uVar5 < 0x7fffffff) {
        local_a4 = (int)uVar5;
      }
      (local_98->S).r[0] = local_a4;
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_a4);
      }
      else {
        *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_a4;
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (0 < local_40) {
        lVar6 = local_40;
        iVar7 = (local_90->S).r[3];
        iVar1 = (local_90->S).r[2];
        iVar9 = (local_90->S).r[0];
        iVar8 = (local_90->S).r[1];
        do {
          iVar3 = iVar8;
          iVar8 = iVar9;
          iVar2 = iVar1;
          uVar4 = (long)iVar7 * (long)(local_90->P).a[3] + (long)iVar2 * (long)(local_90->P).a[2] +
                  (long)iVar3 * (long)(local_90->P).a[1] + (long)iVar8 * (long)(local_90->P).a[0];
          uVar5 = (uVar4 >> 0x1f) + (uVar4 & 0x7fffffff);
          uVar4 = uVar5 - 0x1fffffffc;
          if (uVar5 < 0x1fffffffc) {
            uVar4 = uVar5;
          }
          uVar5 = uVar4 - 0xfffffffe;
          if (uVar4 < 0xfffffffe) {
            uVar5 = uVar4;
          }
          iVar9 = (int)uVar5 + -0x7fffffff;
          if (uVar5 < 0x7fffffff) {
            iVar9 = (int)uVar5;
          }
          lVar6 = lVar6 + -1;
          iVar7 = iVar2;
          iVar1 = iVar3;
        } while (lVar6 != 0);
        (local_90->S).r[3] = iVar2;
        (local_90->S).r[2] = iVar3;
        (local_90->S).r[1] = iVar8;
        (local_90->S).r[0] = iVar9;
      }
      if (0 < local_38) {
        lVar6 = local_38;
        iVar7 = (local_98->S).r[3];
        iVar1 = (local_98->S).r[2];
        iVar9 = (local_98->S).r[0];
        iVar8 = (local_98->S).r[1];
        do {
          iVar3 = iVar8;
          iVar8 = iVar9;
          iVar2 = iVar1;
          uVar4 = (long)iVar7 * (long)(local_98->P).a[3] + (long)iVar2 * (long)(local_98->P).a[2] +
                  (long)iVar3 * (long)(local_98->P).a[1] + (long)iVar8 * (long)(local_98->P).a[0];
          uVar5 = (uVar4 >> 0x1f) + (uVar4 & 0x7fffffff);
          uVar4 = uVar5 - 0x1fffffffc;
          if (uVar5 < 0x1fffffffc) {
            uVar4 = uVar5;
          }
          uVar5 = uVar4 - 0xfffffffe;
          if (uVar4 < 0xfffffffe) {
            uVar5 = uVar4;
          }
          iVar9 = (int)uVar5 + -0x7fffffff;
          if (uVar5 < 0x7fffffff) {
            iVar9 = (int)uVar5;
          }
          lVar6 = lVar6 + -1;
          iVar7 = iVar2;
          iVar1 = iVar3;
        } while (lVar6 != 0);
        (local_98->S).r[3] = iVar2;
        (local_98->S).r[2] = iVar3;
        (local_98->S).r[1] = iVar8;
        (local_98->S).r[0] = iVar9;
      }
      lVar6 = local_a0 + 1;
    } while (lVar6 != local_48);
  }
  std::_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>::
  _Tuple_impl<std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,void>
            (local_50,&local_68,&local_88);
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *)
         local_50;
}

Assistant:

std::tuple<std::vector<typename R::result_type>, std::vector<typename R::result_type>>
generate_list(R &r1, R &r2, const long N, const long skip1, const long skip2) {
  std::vector<typename R::result_type> v1, v2;
  if (N > 0) {
    v1.reserve(N);
    v2.reserve(N);
  }
  for (long i{0}; i < N; ++i) {
    v1.push_back(r1());
    v2.push_back(r2());
    for (long j{0}; j < skip1; ++j)
      r1();
    for (long j{0}; j < skip2; ++j)
      r2();
  }
  return {v1, v2};
}